

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

PaintContext * __thiscall
QWidgetTextControl::getPaintContext(QWidgetTextControl *this,QWidget *widget)

{
  int iVar1;
  ColorRole CVar2;
  QWidgetTextControlPrivate *pQVar3;
  QStyleSheetStyle *pQVar4;
  ulong uVar5;
  QStyle *pQVar6;
  long in_RDX;
  PaintContext *in_RDI;
  long in_FS_OFFSET;
  QStyle *style_1;
  ColorGroup cg;
  QStyle *style;
  QStyleSheetStyle *cssStyle;
  QWidgetTextControlPrivate *d;
  PaintContext *ctx;
  QStyleOption opt_1;
  QStyleOption opt;
  Selection selection;
  QStyleOption option;
  QStyleHintReturnVariant ret;
  QWidget *in_stack_fffffffffffffe48;
  PaintContext *in_stack_fffffffffffffe50;
  QTextFormat *in_stack_fffffffffffffe58;
  QTextFormat *this_00;
  PaintContext *this_01;
  QStyleOption *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  QStyleSheetStyle *in_stack_fffffffffffffe80;
  undefined1 local_148 [64];
  QTextFormat local_108 [32];
  undefined1 local_e8 [40];
  QPalette QStack_c0;
  undefined1 *local_a8;
  PaintContext local_a0;
  QVariant local_50;
  undefined1 local_30 [40];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  pQVar3 = d_func((QWidgetTextControl *)0x720b02);
  memcpy(this_01,&DAT_00b2a550,0x50);
  QAbstractTextDocumentLayout::PaintContext::PaintContext(in_stack_fffffffffffffe50);
  QList<QAbstractTextDocumentLayout::Selection>::operator=
            ((QList<QAbstractTextDocumentLayout::Selection> *)in_stack_fffffffffffffe50,
             (QList<QAbstractTextDocumentLayout::Selection> *)in_stack_fffffffffffffe48);
  QPalette::operator=(&this_01->palette,(QPalette *)&pQVar3->palette);
  if (in_RDX != 0) {
    QWidget::style(in_stack_fffffffffffffe48);
    pQVar4 = qt_styleSheet((QStyle *)0x720b7e);
    if (pQVar4 != (QStyleSheetStyle *)0x0) {
      memset((void *)((long)&local_a0 + 0x10),0xaa,0x40);
      QStyleOption::QStyleOption((QStyleOption *)this_01,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
      QStyleOption::initFrom((QStyleOption *)this_01,(QWidget *)in_RDI);
      QStyleSheetStyle::styleSheetPalette
                (in_stack_fffffffffffffe80,
                 (QWidget *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                 in_stack_fffffffffffffe70,(QPalette *)this_01);
      QStyleOption::~QStyleOption((QStyleOption *)in_stack_fffffffffffffe50);
    }
  }
  if (((pQVar3->cursorOn & 1U) != 0) && ((pQVar3->isEnabled & 1U) != 0)) {
    if ((pQVar3->hideCursor & 1U) == 0) {
      if (pQVar3->preeditCursor == 0) {
        iVar1 = QTextCursor::position();
        this_01->cursorPosition = iVar1;
      }
      else {
        this_01->cursorPosition = -(pQVar3->preeditCursor + 2);
      }
    }
    else {
      this_01->cursorPosition = -1;
    }
  }
  uVar5 = QTextCursor::isNull();
  if ((uVar5 & 1) == 0) {
    iVar1 = QTextCursor::position();
    this_01->cursorPosition = iVar1;
  }
  uVar5 = QTextCursor::hasSelection();
  if ((uVar5 & 1) != 0) {
    local_a8 = &DAT_aaaaaaaaaaaaaaaa;
    local_a0._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_a0.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    QAbstractTextDocumentLayout::Selection::Selection((Selection *)in_stack_fffffffffffffe50);
    QTextCursor::operator=((QTextCursor *)&local_a8,&pQVar3->cursor);
    if ((pQVar3->cursorIsFocusIndicator & 1U) == 0) {
      CVar2 = Light;
      if ((pQVar3->hasFocus & 1U) != 0) {
        CVar2 = WindowText;
      }
      in_stack_fffffffffffffe50 = &local_a0;
      QPalette::brush((int)this_01 + 8,CVar2);
      QTextFormat::setBackground(in_stack_fffffffffffffe58,(QBrush *)in_stack_fffffffffffffe50);
      this_00 = (QTextFormat *)&local_a0;
      QPalette::brush((int)this_01 + 8,CVar2);
      QTextFormat::setForeground(this_00,(QBrush *)in_stack_fffffffffffffe50);
      memset(local_148,0xaa,0x40);
      QStyleOption::QStyleOption((QStyleOption *)this_01,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
      pQVar6 = QApplication::style();
      if (in_RDX != 0) {
        QStyleOption::initFrom((QStyleOption *)this_01,(QWidget *)in_RDI);
        pQVar6 = QWidget::style(in_stack_fffffffffffffe48);
      }
      iVar1 = (**(code **)(*(long *)pQVar6 + 0xf0))(pQVar6,0x1d,local_148,in_RDX,0);
      if (iVar1 != 0) {
        in_stack_fffffffffffffe48 = (QWidget *)&local_a0;
        ::QVariant::QVariant(&local_50,true);
        QTextFormat::setProperty((int)in_stack_fffffffffffffe48,(QVariant *)0x6000);
        ::QVariant::~QVariant(&local_50);
      }
      QStyleOption::~QStyleOption((QStyleOption *)in_stack_fffffffffffffe50);
    }
    else {
      memset(local_e8,0xaa,0x40);
      QStyleOption::QStyleOption((QStyleOption *)this_01,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
      QPalette::operator=(&QStack_c0,(QPalette *)&this_01->palette);
      memset(local_30,0xaa,0x28);
      QStyleHintReturnVariant::QStyleHintReturnVariant
                ((QStyleHintReturnVariant *)in_stack_fffffffffffffe50);
      pQVar6 = QApplication::style();
      if (in_RDX != 0) {
        pQVar6 = QWidget::style(in_stack_fffffffffffffe48);
      }
      (**(code **)(*(long *)pQVar6 + 0xf0))(pQVar6,0x4d,local_e8,in_RDX,local_30);
      qvariant_cast<QTextFormat>((QVariant *)this_01);
      QTextFormat::toCharFormat();
      QTextCharFormat::operator=
                ((QTextCharFormat *)in_stack_fffffffffffffe50,
                 (QTextCharFormat *)in_stack_fffffffffffffe48);
      QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x720e29);
      QTextFormat::~QTextFormat(local_108);
      QStyleHintReturnVariant::~QStyleHintReturnVariant
                ((QStyleHintReturnVariant *)in_stack_fffffffffffffe50);
      QStyleOption::~QStyleOption((QStyleOption *)in_stack_fffffffffffffe50);
    }
    QList<QAbstractTextDocumentLayout::Selection>::append
              ((QList<QAbstractTextDocumentLayout::Selection> *)in_stack_fffffffffffffe50,
               (parameter_type)in_stack_fffffffffffffe48);
    QAbstractTextDocumentLayout::Selection::~Selection((Selection *)in_stack_fffffffffffffe50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QAbstractTextDocumentLayout::PaintContext QWidgetTextControl::getPaintContext(QWidget *widget) const
{
    Q_D(const QWidgetTextControl);

    QAbstractTextDocumentLayout::PaintContext ctx;

    ctx.selections = d->extraSelections;
    ctx.palette = d->palette;
#if QT_CONFIG(style_stylesheet)
    if (widget) {
        if (auto cssStyle = qt_styleSheet(widget->style())) {
            QStyleOption option;
            option.initFrom(widget);
            cssStyle->styleSheetPalette(widget, &option, &ctx.palette);
        }
    }
#endif // style_stylesheet
    if (d->cursorOn && d->isEnabled) {
        if (d->hideCursor)
            ctx.cursorPosition = -1;
        else if (d->preeditCursor != 0)
            ctx.cursorPosition = - (d->preeditCursor + 2);
        else
            ctx.cursorPosition = d->cursor.position();
    }

    if (!d->dndFeedbackCursor.isNull())
        ctx.cursorPosition = d->dndFeedbackCursor.position();
#ifdef QT_KEYPAD_NAVIGATION
    if (!QApplicationPrivate::keypadNavigationEnabled() || d->hasEditFocus)
#endif
    if (d->cursor.hasSelection()) {
        QAbstractTextDocumentLayout::Selection selection;
        selection.cursor = d->cursor;
        if (d->cursorIsFocusIndicator) {
            QStyleOption opt;
            opt.palette = ctx.palette;
            QStyleHintReturnVariant ret;
            QStyle *style = QApplication::style();
            if (widget)
                style = widget->style();
            style->styleHint(QStyle::SH_TextControl_FocusIndicatorTextCharFormat, &opt, widget, &ret);
            selection.format = qvariant_cast<QTextFormat>(ret.variant).toCharFormat();
        } else {
            QPalette::ColorGroup cg = d->hasFocus ? QPalette::Active : QPalette::Inactive;
            selection.format.setBackground(ctx.palette.brush(cg, QPalette::Highlight));
            selection.format.setForeground(ctx.palette.brush(cg, QPalette::HighlightedText));
            QStyleOption opt;
            QStyle *style = QApplication::style();
            if (widget) {
                opt.initFrom(widget);
                style = widget->style();
            }
            if (style->styleHint(QStyle::SH_RichText_FullWidthSelection, &opt, widget))
                selection.format.setProperty(QTextFormat::FullWidthSelection, true);
        }
        ctx.selections.append(selection);
    }

    return ctx;
}